

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O0

int sfp_get_fibre_channel_speed(tcv_t *tcv,fibre_channel_speed_t *speed)

{
  fibre_channel_speed_t *speed_local;
  tcv_t *tcv_local;
  
  if (((tcv == (tcv_t *)0x0) || (speed == (fibre_channel_speed_t *)0x0)) ||
     (tcv->data == (void *)0x0)) {
    tcv_local._4_4_ = -4;
  }
  else {
    speed->bmp = '\0';
    speed->bmp = speed->bmp | (byte)((int)(*(byte *)((long)tcv->data + 10) & 0xfc) >> 1);
    speed->bmp = speed->bmp | *(byte *)((long)tcv->data + 10) & 1;
    tcv_local._4_4_ = 0;
  }
  return tcv_local._4_4_;
}

Assistant:

int sfp_get_fibre_channel_speed(tcv_t *tcv, fibre_channel_speed_t *speed)
{
	if (tcv == NULL || speed == NULL || tcv->data == NULL)
		return TCV_ERR_INVALID_ARG;

	/* Clear bitmap */
	speed->bmp = 0;

	/* Fill bitmap */
	speed->bmp |= (((sfp_data_t*)tcv->data)->a0[MEDIA_REG] & MEDIA_MASK_1) >> 1;
	speed->bmp |= ((sfp_data_t*)tcv->data)->a0[MEDIA_REG] & MEDIA_MASK_2;

	return 0;
}